

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O1

Result __thiscall
tonk::SessionOutgoing::sendQueuedReliable
          (SessionOutgoing *this,OutgoingQueuedDatagram *datagram,uint reliableOffset)

{
  uint uVar1;
  SiameseResult SVar2;
  uint uVar3;
  _func_int **pp_Var4;
  uint in_ECX;
  undefined4 in_register_00000014;
  OutgoingQueuedDatagram *datagram_00;
  uint uVar5;
  SiameseOriginalPacket original;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  SiameseOriginalPacket local_30;
  
  datagram_00 = (OutgoingQueuedDatagram *)CONCAT44(in_register_00000014,reliableOffset);
  uVar1 = datagram_00->NextWriteOffset - in_ECX;
  if (datagram_00->NextWriteOffset < in_ECX || uVar1 == 0) {
    uVar3 = 0;
    uVar1 = 0;
    goto LAB_0014b75b;
  }
  local_30.Data = datagram_00->Data + in_ECX;
  local_30.PacketNum = 0;
  local_30.DataBytes = uVar1;
  SVar2 = siamese_encoder_add((SiameseEncoder)datagram[0x1e].Next,&local_30);
  if (SVar2 != Siamese_Success) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"siamese_encoder_add failed","");
    pp_Var4 = (_func_int **)operator_new(0x38);
    *pp_Var4 = (_func_int *)"SessionOutgoing::Flush";
    pp_Var4[1] = (_func_int *)(pp_Var4 + 3);
    std::__cxx11::string::_M_construct<char*>((string *)(pp_Var4 + 1),local_50,local_50 + local_48);
    *(undefined4 *)(pp_Var4 + 5) = 1;
    pp_Var4[6] = (_func_int *)(long)(int)SVar2;
    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var4;
    if (local_50 == local_40) {
      return (Result)(ErrorResult *)this;
    }
    operator_delete(local_50);
    return (Result)(ErrorResult *)this;
  }
  if ((char)datagram[0x411].NextWriteOffset == '\x01') {
    uVar3 = local_30.PacketNum - *(int *)&datagram[0x20].Next;
    uVar1 = -uVar3;
    if (0 < (int)uVar3) {
      uVar1 = uVar3;
    }
    uVar3 = local_30.PacketNum - datagram[0x20].NextWriteOffset;
    uVar5 = -uVar3;
    if (0 < (int)uVar3) {
      uVar5 = uVar3;
    }
    if (uVar5 < uVar1) {
      uVar5 = uVar1;
    }
    uVar3 = 2 - (uVar5 < 0x7f);
    if (0x7ffe < uVar5) goto LAB_0014b741;
  }
  else {
LAB_0014b741:
    uVar3 = 3;
  }
  datagram[0x20].NextWriteOffset = local_30.PacketNum + 1 & 0x3fffff;
  uVar1 = local_30.PacketNum;
LAB_0014b75b:
  sendQueuedDatagram((SessionOutgoing *)datagram,datagram_00,uVar3,uVar1);
  (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::sendQueuedReliable(
    OutgoingQueuedDatagram* datagram,
    unsigned reliableOffset)
{
    TONK_DEBUG_ASSERT(datagram->NextWriteOffset >= reliableOffset);
    if (datagram->NextWriteOffset <= reliableOffset) {
        sendQueuedDatagram(datagram, 0, 0);
        return Result::Success();
    }

    SiameseOriginalPacket original;
    original.Data = datagram->Data + reliableOffset;
    original.DataBytes = datagram->NextWriteOffset - reliableOffset;
    original.PacketNum = 0;

    // Add reliable data to the Siamese FEC encoder
    const int addResult = siamese_encoder_add(FECEncoder, &original);

    if (addResult != Siamese_Success) {
        TONK_DEBUG_BREAK(); // Should never happen
        return Result("SessionOutgoing::Flush", "siamese_encoder_add failed", ErrorType::Siamese, addResult);
    }

    const unsigned packetNum = original.PacketNum;
    const unsigned packetNumBytes = getPacketNumBytes(packetNum);

    // Update last sent packet sequence number.
    // Used for AckAck generation and sequence number compression
    TONK_DEBUG_ASSERT(NextSequenceNumber == packetNum);
    NextSequenceNumber = SIAMESE_PACKET_NUM_INC(packetNum);

    sendQueuedDatagram(datagram, packetNumBytes, packetNum);

#ifdef TONK_ENABLE_VERBOSE_OUTGOING
    m_Reliable++;
#endif // TONK_ENABLE_VERBOSE_OUTGOING

    return Result::Success();
}